

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioport.c
# Opt level: O2

void cpu_outl_x86_64(uc_struct_conflict *uc,uint32_t addr,uint32_t val)

{
  void *pvVar1;
  list_item *plVar2;
  
  plVar2 = (list_item *)(uc->hook + 1);
  while ((plVar2 = plVar2->next, plVar2 != (list_item *)0x0 &&
         (pvVar1 = plVar2->data, pvVar1 != (void *)0x0))) {
    if ((*(char *)((long)pvVar1 + 0x14) == '\0') && (*(int *)((long)pvVar1 + 4) == 500)) {
      (**(code **)((long)pvVar1 + 0x28))(uc,addr,4,val,*(undefined8 *)((long)pvVar1 + 0x30));
    }
  }
  return;
}

Assistant:

void cpu_outl(struct uc_struct *uc, uint32_t addr, uint32_t val)
{
    // uint8_t buf[4];

    // stl_p(buf, val);
    // address_space_write(&uc->address_space_io, addr, MEMTXATTRS_UNSPECIFIED,
    //                     buf, 4);

    //LOG_IOPORT("outl: %04"FMT_pioaddr" %08"PRIx32"\n", addr, val);
    // Unicorn: call registered OUT callbacks
    struct hook *hook;
    HOOK_FOREACH_VAR_DECLARE;
    HOOK_FOREACH(uc, hook, UC_HOOK_INSN) {
        if (hook->to_delete)
            continue;
        if (hook->insn == UC_X86_INS_OUT)
            ((uc_cb_insn_out_t)hook->callback)(uc, addr, 4, val, hook->user_data);
    }
}